

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

double __thiscall
HighsSparseMatrix::computeDot
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *array,HighsInt use_col)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  int in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  HighsInt iEl;
  double result;
  int local_24;
  double local_20;
  
  local_20 = 0.0;
  if (in_EDX < *(int *)(in_RDI + 4)) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)in_EDX);
    for (local_24 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)(in_EDX + 1))
        , local_24 < *pvVar2; local_24 = local_24 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_24);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)*pvVar2);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_24)
      ;
      local_20 = dVar1 * *pvVar3 + local_20;
    }
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RSI,(long)(in_EDX - *(int *)(in_RDI + 4)));
    local_20 = *pvVar3;
  }
  return local_20;
}

Assistant:

double HighsSparseMatrix::computeDot(const std::vector<double>& array,
                                     const HighsInt use_col) const {
  assert(this->isColwise());
  double result = 0;
  if (use_col < this->num_col_) {
    for (HighsInt iEl = this->start_[use_col]; iEl < this->start_[use_col + 1];
         iEl++)
      result += array[this->index_[iEl]] * this->value_[iEl];
  } else {
    result = array[use_col - this->num_col_];
  }
  return result;
}